

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int g_00;
  node *pnVar2;
  const_reference ppnVar3;
  ostream *poVar4;
  float average;
  node *current;
  node *pnStack_2c8;
  bool finished;
  undefined1 local_2c0 [8];
  min_heap to_expand;
  int f;
  int h;
  int g;
  Pyraminx myPyraminx;
  float local_230;
  int i;
  float count;
  int k;
  int num_instances;
  int k_stop;
  int k_start;
  ostream local_210 [8];
  ofstream logfile;
  
  std::ofstream::ofstream(local_210);
  std::operator|(_S_out,_S_app);
  std::ofstream::open((char *)local_210,0x11e028);
  std::operator<<(local_210,"k, nodes expanded\n");
  std::ofstream::close();
  i = 3;
  do {
    if (0x14 < i) {
      std::ofstream::~ofstream(local_210);
      return 0;
    }
    local_230 = 0.0;
    for (myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_ = 0;
        myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._4_4_ < 5;
        myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._4_4_ = myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_ + 1) {
      Pyraminx::Pyraminx((Pyraminx *)&h);
      Pyraminx::scramble((Pyraminx *)&h,i);
      printf("Solving puzzle randomized with %i moves...\n",(ulong)(uint)i);
      Pyraminx::print((Pyraminx *)&h);
      to_expand._28_4_ = Pyraminx::get_heuristic((Pyraminx *)&h);
      std::priority_queue<node*,std::vector<node*,std::allocator<node*>>,Compare>::
      priority_queue<std::vector<node*,std::allocator<node*>>,void>
                ((priority_queue<node*,std::vector<node*,std::allocator<node*>>,Compare> *)local_2c0
                );
      pnVar2 = (node *)operator_new(0x18);
      node::node(pnVar2,to_expand._28_4_);
      pnStack_2c8 = pnVar2;
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::push
                ((priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare> *)
                 local_2c0,&stack0xfffffffffffffd38);
      while (bVar1 = std::
                     priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::
                     empty((priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>
                            *)local_2c0), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppnVar3 = std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>
                  ::top((priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>
                         *)local_2c0);
        pnVar2 = *ppnVar3;
        std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::pop
                  ((priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare> *)
                   local_2c0);
        g_00 = apply_moves(pnVar2,(Pyraminx *)&h);
        bVar1 = Pyraminx::is_solved((Pyraminx *)&h);
        if (bVar1) {
          printf("Solved! Solution is: ");
          print_move_list(pnVar2);
          free_nodes((min_heap *)local_2c0);
          break;
        }
        local_230 = local_230 + 1.0;
        enqueue_children((min_heap *)local_2c0,pnVar2,(Pyraminx *)&h,g_00);
        undo_moves(pnVar2,(Pyraminx *)&h);
      }
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::
      ~priority_queue((priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>
                       *)local_2c0);
      Pyraminx::~Pyraminx((Pyraminx *)&h);
    }
    std::operator|(_S_out,_S_app);
    std::ofstream::open((char *)local_210,0x11e028);
    poVar4 = (ostream *)std::ostream::operator<<(local_210,i);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_230 / 5.0);
    std::operator<<(poVar4,"\n");
    std::ofstream::close();
    i = i + 1;
  } while( true );
}

Assistant:

int main(){
    // Open file to write out number of expanded nodes:
    std::ofstream logfile;
    logfile.open ("log.txt", std::ios::out | std::ios::app );
    logfile << "k, nodes expanded\n";
    logfile.close();

    int k_start = 3;
    int k_stop = 20;
    int num_instances = 5;
    // For each k, solve 5 puzzles randomized with k moves
    for(int k = k_start; k <= k_stop; k++){
        float count = 0;
        for(int i = 0; i < num_instances; i++){
            Pyraminx myPyraminx;
            myPyraminx.scramble(k);
            printf("Solving puzzle randomized with %i moves...\n", k);
            myPyraminx.print();

            // Create and enqueue root node
            int g = 0;
            int h = myPyraminx.get_heuristic();
            int f = g + h;
    
            min_heap to_expand;
            
            to_expand.push(new node(f));

            // Explore tree
            bool finished;
            while(!to_expand.empty()){
                node* current = to_expand.top();
                to_expand.pop();
                g = apply_moves(current, myPyraminx);
                finished = myPyraminx.is_solved();
                if(finished){
                    printf("Solved! Solution is: ");
                    print_move_list(*current);
                    free_nodes(to_expand);
                    break;
                }
                else{
                    count++;
                    enqueue_children(to_expand, current, myPyraminx, g);
                    undo_moves(current, myPyraminx);
                }
            }
        }// i for loop (5 instances)
        // We reopen and close the file each time because we don't want to lose
        // the data if termination is early
        logfile.open ("log.txt", std::ios::out | std::ios::app );
        float average = count / num_instances;
        logfile << k << ", " << average << "\n";
        logfile.close();
    }// k for loop (k from 3 to 20) 
}